

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_on_goaway_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_on_frame_recv_callback p_Var1;
  bool bVar2;
  int iVar3;
  char *reason;
  
  if ((frame->hd).stream_id != 0) {
    reason = "GOAWAY: stream_id != 0";
LAB_0010dd8f:
    iVar3 = session_handle_invalid_connection(session,frame,-0x1f9,reason);
    return iVar3;
  }
  iVar3 = (frame->priority).pri_spec.stream_id;
  if (((0 < iVar3) && (((session->server == '\0' ^ (byte)iVar3) & 1) != 0)) ||
     (session->remote_last_stream_id < iVar3)) {
    reason = "GOAWAY: invalid last_stream_id";
    goto LAB_0010dd8f;
  }
  session->goaway_flags = session->goaway_flags | 8;
  session->remote_last_stream_id = (frame->priority).pri_spec.stream_id;
  p_Var1 = (session->callbacks).on_frame_recv_callback;
  if (p_Var1 != (nghttp2_on_frame_recv_callback)0x0) {
    iVar3 = (*p_Var1)(session,frame,session->user_data);
    if (iVar3 != 0) {
      iVar3 = -0x386;
      bVar2 = false;
      goto LAB_0010dde4;
    }
  }
  iVar3 = 0;
  bVar2 = true;
LAB_0010dde4:
  if (bVar2) {
    iVar3 = session_close_stream_on_goaway(session,(frame->priority).pri_spec.stream_id,0);
    return iVar3;
  }
  return iVar3;
}

Assistant:

int nghttp2_session_on_goaway_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  int rv;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: stream_id != 0");
  }
  /* Spec says Endpoints MUST NOT increase the value they send in the
     last stream identifier. */
  if ((frame->goaway.last_stream_id > 0 &&
       !nghttp2_session_is_my_stream_id(session,
                                        frame->goaway.last_stream_id)) ||
      session->remote_last_stream_id < frame->goaway.last_stream_id) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: invalid last_stream_id");
  }

  session->goaway_flags |= NGHTTP2_GOAWAY_RECV;

  session->remote_last_stream_id = frame->goaway.last_stream_id;

  rv = session_call_on_frame_received(session, frame);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                        0);
}